

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O2

MutableSubtree ts_subtree_make_mut(SubtreePool *pool,Subtree self)

{
  uint32_t uVar1;
  Subtree SVar2;
  Subtree *__dest;
  long lVar3;
  Subtree SVar4;
  Subtree SVar5;
  uint32_t i;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  anon_union_24_2_84168a9f_for_ExternalScannerState_0 local_48;
  undefined8 uStack_30;
  
  bVar8 = 0;
  if ((((ulong)self.ptr & 1) == 0) && ((self.ptr)->ref_count != 1)) {
    SVar2.ptr = ts_subtree_pool_allocate(pool);
    SVar4 = self;
    SVar5.ptr = SVar2.ptr;
    for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar1 = ((Length *)((long)SVar4 + 4))->bytes;
      *(uint32_t *)SVar5 = *(uint32_t *)SVar4;
      ((Length *)((long)SVar5 + 4))->bytes = uVar1;
      SVar4.data = SVar4.data + (ulong)bVar8 * -0x10 + 8;
      SVar5.data = SVar5.data + (ulong)bVar8 * -0x10 + 8;
    }
    if ((SVar2.ptr)->child_count == 0) {
      if (((SVar2.ptr)->field_0x2c & 0x40) != 0) {
        ts_external_scanner_state_copy
                  ((ExternalScannerState *)&local_48,&((self.ptr)->field_17).external_scanner_state)
        ;
        *(undefined8 *)((long)&(SVar2.ptr)->field_17 + 0x10) = local_48._16_8_;
        *(undefined8 *)((long)&(SVar2.ptr)->field_17 + 0x18) = uStack_30;
        ((SVar2.ptr)->field_17).field_0.children = (Subtree *)local_48.long_data;
        *(undefined8 *)((long)&(SVar2.ptr)->field_17 + 8) = local_48._8_8_;
      }
    }
    else {
      __dest = (Subtree *)ts_calloc((ulong)(self.ptr)->child_count,8);
      ((SVar2.ptr)->field_17).field_0.children = __dest;
      uVar7 = (ulong)(SVar2.ptr)->child_count;
      memcpy(__dest,((self.ptr)->field_17).field_0.children,uVar7 << 3);
      for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 1) {
        ts_subtree_retain(((SVar2.ptr)->field_17).field_0.children[uVar6]);
        uVar7 = (ulong)(SVar2.ptr)->child_count;
      }
    }
    (SVar2.ptr)->ref_count = 1;
    ts_subtree_release(pool,self);
    self.ptr = SVar2.ptr;
  }
  return (MutableSubtree)self.data;
}

Assistant:

MutableSubtree ts_subtree_make_mut(SubtreePool *pool, Subtree self) {
  if (self.data.is_inline) return (MutableSubtree) {self.data};
  if (self.ptr->ref_count == 1) return ts_subtree_to_mut_unsafe(self);

  SubtreeHeapData *result = ts_subtree_pool_allocate(pool);
  memcpy(result, self.ptr, sizeof(SubtreeHeapData));
  if (result->child_count > 0) {
    result->children = ts_calloc(self.ptr->child_count, sizeof(Subtree));
    memcpy(result->children, self.ptr->children, result->child_count * sizeof(Subtree));
    for (uint32_t i = 0; i < result->child_count; i++) {
      ts_subtree_retain(result->children[i]);
    }
  } else if (result->has_external_tokens) {
    result->external_scanner_state = ts_external_scanner_state_copy(&self.ptr->external_scanner_state);
  }
  result->ref_count = 1;
  ts_subtree_release(pool, self);
  return (MutableSubtree) {.ptr = result};
}